

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void libcellml::updateUnitsMap(UnitsPtr *units,UnitsMap *unitsMap,double exp)

{
  EntityImpl *pEVar1;
  bool bVar2;
  iterator iVar3;
  element_type *this;
  size_t index;
  string unitsName;
  ModelPtr model;
  UnitsPtr importedUnits;
  UnitsPtr refUnits;
  ImportSourcePtr importSource;
  double uExp;
  double expMult;
  string local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined1 local_a8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  double local_38;
  
  local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)exp;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)exp;
  bVar2 = Units::isBaseUnit((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr);
  if (bVar2) {
    NamedEntity::name_abi_cxx11_
              (&local_d0,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            ::find(&unitsMap->_M_t,&local_d0);
    if ((_Rb_tree_header *)iVar3._M_node == &(unitsMap->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::_M_emplace_unique<std::__cxx11::string&,double&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)unitsMap,&local_d0,(double *)&local_40);
    }
    else {
      *(double *)(iVar3._M_node + 2) = (double)local_b0 + *(double *)(iVar3._M_node + 2);
    }
  }
  else {
    bVar2 = isStandardUnit(units);
    if (!bVar2) {
      bVar2 = ImportedEntity::isImport
                        (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->super_ImportedEntity);
      if (!bVar2) {
        this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        if (*(size_type *)((long)&pEVar1[2].mId.field_2 + 8) ==
            pEVar1[2].mId.field_2._M_allocated_capacity) {
          return;
        }
        index = 0;
        do {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          local_78._16_8_ = &local_58;
          local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_58._M_local_buf[0] = '\0';
          local_a8._16_8_ = &local_88;
          local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._M_local_buf[0] = '\0';
          Units::unitAttributes
                    (this,index,&local_d0,(string *)(local_78 + 0x10),(double *)&local_48,&local_38,
                     (string *)(local_a8 + 0x10));
          bVar2 = isStandardUnitName(&local_d0);
          if (bVar2) {
            updateUnitsMapWithStandardUnit(&local_d0,unitsMap,(double)local_48 * (double)local_b0);
          }
          else {
            local_78._0_8_ =
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_78._8_8_ =
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count
                     + 1;
              }
            }
            owningModel((ParentedEntityConstPtr *)local_a8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
            }
            Model::units((Model *)local_78,(string *)local_a8._0_8_);
            local_b0 = local_40._M_pi;
            updateUnitsMap((UnitsPtr *)local_78,unitsMap,(double)local_48 * (double)local_40._M_pi);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._16_8_ != &local_88) {
            operator_delete((void *)local_a8._16_8_,
                            CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._16_8_ != &local_58) {
            operator_delete((void *)local_78._16_8_,
                            CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
          index = index + 1;
        } while (index < (ulong)(((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                                        pEVar1[2].mId.field_2._M_allocated_capacity) >> 4) *
                                0x6db6db6db6db6db7));
        return;
      }
      ImportedEntity::importSource
                (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      ImportSource::model((ImportSource *)local_a8);
      ImportedEntity::importReference_abi_cxx11_
                (&local_d0,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      Model::units((Model *)(local_a8 + 0x10),(string *)local_a8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      updateUnitsMap((UnitsPtr *)(local_a8 + 0x10),unitsMap,1.0);
      if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
      }
      if (local_60._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
      return;
    }
    NamedEntity::name_abi_cxx11_
              (&local_d0,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    updateUnitsMapWithStandardUnit(&local_d0,unitsMap,(double)local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void updateUnitsMap(const UnitsPtr &units, UnitsMap &unitsMap, double exp = 1.0)
{
    if (units->isBaseUnit()) {
        auto unitsName = units->name();
        auto found = unitsMap.find(unitsName);
        if (found == unitsMap.end()) {
            unitsMap.emplace(unitsName, exp);
        } else {
            found->second += exp;
        }
    } else if (isStandardUnit(units)) {
        updateUnitsMapWithStandardUnit(units->name(), unitsMap, exp);
    } else if (units->isImport()) {
        auto importSource = units->importSource();
        auto importedUnits = importSource->model()->units(units->importReference());
        updateUnitsMap(importedUnits, unitsMap);
    } else {
        for (size_t i = 0; i < units->unitCount(); ++i) {
            std::string ref;
            std::string pre;
            std::string id;
            double expMult;
            double uExp;
            units->unitAttributes(i, ref, pre, uExp, expMult, id);
            if (isStandardUnitName(ref)) {
                updateUnitsMapWithStandardUnit(ref, unitsMap, uExp * exp);
            } else {
                auto model = owningModel(units);
                auto refUnits = model->units(ref);
                updateUnitsMap(refUnits, unitsMap, uExp * exp);
            }
        }
    }
}